

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode cf_ssl_peer_key_add_path(dynbuf *buf,char *name,char *path,_Bool *is_local)

{
  CURLcode CVar1;
  char *__ptr;
  CURLcode r;
  char *abspath;
  _Bool *is_local_local;
  char *path_local;
  char *name_local;
  dynbuf *buf_local;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    buf_local._4_4_ = CURLE_OK;
  }
  else {
    if (*path != '/') {
      __ptr = realpath(path,(char *)0x0);
      if (__ptr != (char *)0x0) {
        CVar1 = Curl_dyn_addf(buf,":%s-%s",name,__ptr);
        free(__ptr);
        return CVar1;
      }
      *is_local = true;
    }
    buf_local._4_4_ = Curl_dyn_addf(buf,":%s-%s",name,path);
  }
  return buf_local._4_4_;
}

Assistant:

static CURLcode cf_ssl_peer_key_add_path(struct dynbuf *buf,
                                          const char *name,
                                          char *path,
                                          bool *is_local)
{
  if(path && path[0]) {
    /* We try to add absolute paths, so that the session key can stay
     * valid when used in another process with different CWD. However,
     * when a path does not exist, this does not work. Then, we add
     * the path as is. */
#ifdef UNDER_CE
    (void)is_local;
    return Curl_dyn_addf(buf, ":%s-%s", name, path);
#elif defined(_WIN32)
    char abspath[_MAX_PATH];
    if(_fullpath(abspath, path, _MAX_PATH))
      return Curl_dyn_addf(buf, ":%s-%s", name, abspath);
    *is_local = TRUE;
#elif defined(HAVE_REALPATH)
    if(path[0] != '/') {
      char *abspath = realpath(path, NULL);
      if(abspath) {
        CURLcode r = Curl_dyn_addf(buf, ":%s-%s", name, abspath);
        (free)(abspath); /* allocated by libc, free without memdebug */
        return r;
      }
      *is_local = TRUE;
    }
#endif
    return Curl_dyn_addf(buf, ":%s-%s", name, path);
  }
  return CURLE_OK;
}